

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_pointer_kernel_1.h
# Opt level: O0

void __thiscall
dlib::bound_function_pointer::swap(bound_function_pointer *this,bound_function_pointer *item)

{
  bound_function_helper_base_base *pbVar1;
  void *pvVar2;
  stack_based_memory_block<128UL> *in_RSI;
  stack_based_memory_block<128UL> *in_RDI;
  bound_function_pointer temp;
  bound_function_pointer *in_stack_ffffffffffffff38;
  
  bound_function_pointer((bound_function_pointer *)in_RDI,in_stack_ffffffffffffff38);
  destroy_bf_memory((bound_function_pointer *)0x2a06a3);
  pbVar1 = bf((bound_function_pointer *)0x2a06af);
  pvVar2 = stack_based_memory_block<128UL>::get(in_RSI);
  (*pbVar1->_vptr_bound_function_helper_base_base[4])(pbVar1,pvVar2);
  destroy_bf_memory((bound_function_pointer *)0x2a06e0);
  pbVar1 = bf((bound_function_pointer *)0x2a06ec);
  pvVar2 = stack_based_memory_block<128UL>::get(in_RDI);
  (*pbVar1->_vptr_bound_function_helper_base_base[4])(pbVar1,pvVar2);
  ~bound_function_pointer((bound_function_pointer *)0x2a071a);
  return;
}

Assistant:

void swap (
            bound_function_pointer& item
        )
        {
            // make a temp copy of item
            bound_function_pointer temp(item);

            // destory the stuff in item
            item.destroy_bf_memory();
            // copy *this into item
            bf()->clone(item.bf_memory.get());

            // destory the stuff in this 
            destroy_bf_memory();
            // copy temp into *this
            temp.bf()->clone(bf_memory.get());
        }